

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadLineDefs2(MapData *map)

{
  double *pdVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  FileReader *pFVar5;
  undefined1 auVar6 [16];
  DWORD DVar7;
  uint uVar8;
  ushort *buffer;
  ushort *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  line_t *ld;
  
  pFVar5 = map->MapLumps[2].Reader;
  iVar12 = 0;
  if (pFVar5 != (FileReader *)0x0) {
    iVar12 = (int)pFVar5->Length;
  }
  uVar8 = iVar12 >> 4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(int)uVar8;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x98),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0x98),0);
  }
  numlines = uVar8;
  lines = (line_t *)operator_new__(uVar11);
  TArray<int,_int>::Resize(&linemap,uVar8);
  memset(lines,0,(long)numlines * 0x98);
  buffer = (ushort *)operator_new__((long)iVar12);
  MapData::Read(map,2,buffer,-1);
  sidecount = 0;
  iVar12 = 0;
  uVar8 = 0;
  do {
    lVar10 = (long)(int)uVar8 << 2;
    while( true ) {
      if (numlines <= (int)uVar8) {
        if (iVar12 != 0) {
          ForceNodeBuild = true;
        }
        P_AllocateSideDefs(sidecount);
        puVar9 = buffer;
        ld = lines;
        for (iVar12 = 0; iVar12 < numlines; iVar12 = iVar12 + 1) {
          ld->portalindex = 0xffffffff;
          for (lVar10 = 0xb; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            ld->args[lVar10 + -0xb] = (uint)*(byte *)((long)puVar9 + lVar10 + -4);
          }
          ld->flags = (uint)puVar9[2];
          ld->special = (uint)(byte)puVar9[3];
          ld->v1 = vertexes + *puVar9;
          ld->v2 = vertexes + puVar9[1];
          ld->alpha = 1.0;
          P_SetSideNum(ld->sidedef,puVar9[6]);
          P_SetSideNum(ld->sidedef + 1,puVar9[7]);
          P_AdjustLine(ld);
          P_SetLineID(iVar12,ld);
          P_SaveLineSpecial(ld);
          DVar7 = level.flags2;
          uVar8 = ld->flags >> 10 & 7;
          ld->activation = 1 << (sbyte)uVar8;
          if ((uVar8 | 4) == 7) {
            ld->activation = 0x28;
          }
          uVar8 = DVar7 << 10;
          ld->flags = ld->flags & 0xffffe3ff | uVar8 & 0x80000 |
                      (DVar7 & 0x800) << 0xb | uVar8 & 0x100000;
          puVar9 = puVar9 + 8;
          ld = ld + 1;
        }
        operator_delete__(buffer);
        return;
      }
      uVar3 = buffer[lVar10 * 2];
      uVar4 = buffer[lVar10 * 2 + 1];
      if (uVar3 == uVar4) break;
      dVar2 = vertexes[uVar3].p.X;
      if ((dVar2 == vertexes[uVar4].p.X) && (!NAN(dVar2) && !NAN(vertexes[uVar4].p.X))) {
        dVar2 = vertexes[uVar3].p.Y;
        pdVar1 = &vertexes[uVar4].p.Y;
        if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) break;
      }
      if (buffer[lVar10 * 2 + 6] == 0xffff) {
        Printf("Line %d has no first side.\n",(ulong)uVar8);
        buffer[lVar10 * 2 + 6] = 0;
      }
      iVar13 = sidecount + 1;
      if (buffer[lVar10 * 2 + 7] != 0xffff) {
        iVar13 = sidecount + 2;
      }
      sidecount = iVar13;
      *(uint *)((long)linemap.Array + lVar10) = uVar8 + iVar12;
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 4;
    }
    Printf("Removing 0-length line %d\n",(ulong)(uVar8 + iVar12));
    iVar13 = numlines + -1;
    memmove(buffer + lVar10 * 2,buffer + lVar10 * 2 + 8,(long)(int)(iVar13 - uVar8) << 4);
    iVar12 = iVar12 + 1;
    numlines = iVar13;
  } while( true );
}

Assistant:

void P_LoadLineDefs2 (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef2_t *mld;
		
	numlines = lumplen / sizeof(maplinedef2_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Remove any lines that have 0 length and count sidedefs used
	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef2_t*)mldf) + i;

		if (mld->v1 == mld->v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}
	if (skipped > 0)
	{
		ForceNodeBuild = true;
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef2_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		int j;

		ld->portalindex = UINT_MAX;

		for (j = 0; j < 5; j++)
			ld->args[j] = mld->args[j];

		ld->flags = LittleShort(mld->flags);
		ld->special = mld->special;

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];
		ld->alpha = 1.;	// [RH] Opaque by default

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SetLineID(i, ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		// convert the activation type
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;
	}
	delete[] mldf;
}